

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int buildCharField(charField *cf,const_bstring b)

{
  byte bVar1;
  int local_24;
  uint c;
  int i;
  const_bstring b_local;
  charField *cf_local;
  
  if (((b == (const_bstring)0x0) || (b->data == (uchar *)0x0)) || (b->slen < 1)) {
    cf_local._4_4_ = -1;
  }
  else {
    memset(cf,0,0x20);
    for (local_24 = 0; local_24 < b->slen; local_24 = local_24 + 1) {
      bVar1 = b->data[local_24] >> 3;
      cf->content[bVar1] = cf->content[bVar1] | (byte)(1L << (b->data[local_24] & 7));
    }
    cf_local._4_4_ = 0;
  }
  return cf_local._4_4_;
}

Assistant:

static int buildCharField (struct charField * cf, const_bstring b) {
int i;
	if (b == NULL || b->data == NULL || b->slen <= 0) return BSTR_ERR;
	memset ((void *) cf->content, 0, sizeof (struct charField));
	for (i=0; i < b->slen; i++) {
		setInCharField (cf, b->data[i]);
	}
	return BSTR_OK;
}